

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bork.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  char **local_18;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_18 = argv;
  argv_local._0_4_ = argc;
  if (argc == 1) {
    repl();
  }
  else if (argc == 2) {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,pcVar1,&local_39);
    from_file((string *)local_38);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  else {
    if (argc != 3) {
      std::operator<<((ostream *)&std::cerr,
                      "SPECIFY 1 FILENAME TO INTERPRET. OR SPECIFY NONE TO START REPL.");
      return 1;
    }
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,pcVar1,&local_71);
    pretty_print((string *)local_70);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {

  if (argc==1)
    repl();

  else if (argc==2) {
    from_file(std::string(argv[1]));
  } else if (argc==3) {

    pretty_print(argv[1]);

  } else {
    std::cerr << "SPECIFY 1 FILENAME TO INTERPRET. OR SPECIFY NONE TO START REPL.";
    return 1;
  }

  return 0;

}